

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectTracker.cpp
# Opt level: O0

void __thiscall
myvk::ObjectTracker::Track
          (ObjectTracker *this,Ptr<Fence> *fence,
          vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>
          *objects)

{
  pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>_>
  *in_RDI;
  multimap<std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>,_std::less<std::shared_ptr<myvk::Fence>_>,_std::allocator<std::pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>_>_>_>
  *in_stack_ffffffffffffff88;
  vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>
  *in_stack_ffffffffffffffa0;
  shared_ptr<myvk::Fence> *in_stack_ffffffffffffffa8;
  pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  std::
  pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>_>
  ::
  pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>,_true>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::
  multimap<std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>,_std::less<std::shared_ptr<myvk::Fence>_>,_std::allocator<std::pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>_>_>_>
  ::insert(in_stack_ffffffffffffff88,(value_type *)0x2e7d95);
  std::
  pair<const_std::shared_ptr<myvk::Fence>,_std::vector<std::shared_ptr<myvk::DeviceObjectBase>,_std::allocator<std::shared_ptr<myvk::DeviceObjectBase>_>_>_>
  ::~pair(in_RDI);
  return;
}

Assistant:

void ObjectTracker::Track(const Ptr<Fence> &fence,
                          const std::vector<Ptr<DeviceObjectBase>> &objects) {
	m_tracker.insert({fence, objects});
}